

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_enum_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cxx::RepeatedEnumFieldGenerator::GenerateMergeFromCodedStreamWithPacking
          (RepeatedEnumFieldGenerator *this,Printer *printer)

{
  char *text;
  
  text = 
  "DO_((::google::protobuf::internal::WireFormatLite::ReadPackedEnumNoInline(\n       input,\n       &$type$_IsValid,\n       this->mutable_$name$())));\n"
  ;
  if (*(char *)(*(long *)(this->descriptor_ + 0x60) + 0x44) != '\0') {
    text = 
    "::google::protobuf::uint32 length;\nDO_(input->ReadVarint32(&length));\n::google::protobuf::io::CodedInputStream::Limit limit = input->PushLimit(length);\nwhile (input->BytesUntilLimit() > 0) {\n  int value;\n  DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<\n         int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(\n       input, &value)));\n  if ($type$_IsValid(value)) {\n    add_$name$(static_cast< $type$ >(value));\n  }\n}\ninput->PopLimit(limit);\n"
    ;
  }
  io::Printer::Print(printer,&this->variables_,text);
  return;
}

Assistant:

void RepeatedEnumFieldGenerator::
GenerateMergeFromCodedStreamWithPacking(io::Printer* printer) const {
  if (!descriptor_->options().packed()) {
    // We use a non-inlined implementation in this case, since this path will
    // rarely be executed.
    printer->Print(variables_,
      "DO_((::google::protobuf::internal::WireFormatLite::ReadPackedEnumNoInline(\n"
      "       input,\n"
      "       &$type$_IsValid,\n"
      "       this->mutable_$name$())));\n");
  } else {
    printer->Print(variables_,
      "::google::protobuf::uint32 length;\n"
      "DO_(input->ReadVarint32(&length));\n"
      "::google::protobuf::io::CodedInputStream::Limit limit = "
          "input->PushLimit(length);\n"
      "while (input->BytesUntilLimit() > 0) {\n"
      "  int value;\n"
      "  DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<\n"
      "         int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(\n"
      "       input, &value)));\n"
      "  if ($type$_IsValid(value)) {\n"
      "    add_$name$(static_cast< $type$ >(value));\n"
      "  }\n"
      "}\n"
      "input->PopLimit(limit);\n");
  }
}